

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_get_subval(adiak_datatype_t *t,adiak_value_t *val,int elem,adiak_datatype_t **subtype,
                    adiak_value_t *subval)

{
  adiak_datatype_t **ppaVar1;
  int iVar2;
  adiak_value_t aVar3;
  int iVar4;
  adiak_datatype_t *datatype;
  ulong uVar5;
  
  if (elem < 0) {
LAB_00105af3:
    *subtype = (adiak_datatype_t *)0x0;
switchD_00105b2c_caseD_0:
    subval->v_long = 0;
    iVar2 = -1;
  }
  else {
    if (t->is_reference == 0) {
      if (elem < t->num_elements) {
        uVar5 = 0;
        if (t->dtype == adiak_tuple) {
          uVar5 = (ulong)(uint)elem;
        }
        *subtype = t->subtype[uVar5];
        aVar3 = *(adiak_value_t *)((long)val->v_ptr + (ulong)(uint)elem * 8);
        goto switchD_00105b2c_caseD_c;
      }
      goto LAB_00105af3;
    }
    if (t->num_ref_elements <= elem) goto LAB_00105af3;
    if (t->dtype == adiak_tuple) {
      ppaVar1 = t->subtype;
      iVar4 = 0;
      for (uVar5 = 0; (uint)elem != uVar5; uVar5 = uVar5 + 1) {
        iVar2 = calc_size(ppaVar1[uVar5]);
        if (iVar2 < 0) goto LAB_00105af3;
        iVar4 = iVar4 + iVar2;
      }
      datatype = ppaVar1[(uint)elem];
    }
    else {
      datatype = *t->subtype;
      iVar4 = calc_size(datatype);
      iVar4 = iVar4 * elem;
      if (iVar4 < 0) goto LAB_00105af3;
    }
    *subtype = datatype;
    iVar2 = 0;
    if (adiak_ulonglong < datatype->dtype) {
      return 0;
    }
    aVar3.v_ptr = (long)iVar4 + val->v_ptr;
    switch(datatype->dtype) {
    case adiak_type_unset:
      goto switchD_00105b2c_caseD_0;
    default:
      aVar3 = *aVar3.v_subval;
    case adiak_range:
    case adiak_set:
    case adiak_list:
    case adiak_tuple:
switchD_00105b2c_caseD_c:
      iVar2 = 0;
      subval->v_subval = (adiak_value_t *)aVar3;
      break;
    case adiak_int:
    case adiak_uint:
      subval->v_int = *aVar3.v_ptr;
      break;
    case adiak_double:
      *subval = *aVar3.v_subval;
    }
  }
  return iVar2;
}

Assistant:

int adiak_get_subval(adiak_datatype_t* t, adiak_value_t* val, int elem, adiak_datatype_t** subtype, adiak_value_t* subval)
{
   /* Return if this is not a container type or we're out-of-bounds. */
   if (elem < 0)
      goto error;

   /* Adiak-owned data:
    * Data is in val->v_subval. Simply return the selected subvalue.
    */
   if (!t->is_reference) {
      if (elem >= t->num_elements)
         goto error;
      *subtype = (t->dtype == adiak_tuple ? t->subtype[elem] : t->subtype[0]);
      *subval = val->v_subval[elem];
      return 0;
   }

   /* Zero-copy data:
    * Data is in val->v_ptr. Make a adiak_value_t for the selected subvalue.
    */

   if (elem >= t->num_ref_elements)
      goto error;

   /* Compute offset of the selected subvalue. */
   int bytes = 0;
   if (t->dtype == adiak_tuple) {
      for (int n = 0; n < elem; ++n) {
         int s = calc_size(t->subtype[n]);
         if (s < 0)
            goto error;
         bytes += s;
      }
      *subtype = t->subtype[elem];
   } else {
      bytes = elem * calc_size(t->subtype[0]);
      if (bytes < 0)
         goto error;
      *subtype = t->subtype[0];
   }

   unsigned char* ptr = ((unsigned char*) val->v_ptr) + bytes;

   switch ((*subtype)->dtype) {
      case adiak_type_unset:
         (*subval).v_ptr = NULL;
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         (*subval).v_long = *((long *) ptr);
         break;
      case adiak_longlong:
      case adiak_ulonglong:
         (*subval).v_longlong = *((long long *) ptr);
         break;
      case adiak_int:
      case adiak_uint:
         (*subval).v_int = *((int *) ptr);
         break;
      case adiak_double:
         (*subval).v_double = *((double *) ptr);
         break;
      case adiak_timeval:
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         (*subval).v_ptr = *((void**) ptr);
         break;
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
         (*subval).v_ptr = (void*) ptr;
         break;
   }

   return 0;

error:
   *subtype = NULL;
   (*subval).v_ptr = NULL;
   return -1;
}